

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O3

iterator * __thiscall QTextFrame::iterator::operator--(iterator *this)

{
  BlockMap *this_00;
  FragmentMap *this_01;
  uint *puVar1;
  char16_t cVar2;
  QTextDocumentPrivate *this_02;
  Header *pHVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  uint p;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  QTextFrame *pQVar10;
  uint uVar11;
  
  this_02 = *(QTextDocumentPrivate **)
             (*(long *)(*(long *)&(this->f->super_QTextObject).field_0x8 + 0x10) + 8);
  this_00 = &this_02->blocks;
  if (this->cf == (QTextFrame *)0x0) {
    uVar11 = this->cb;
    uVar8 = (ulong)uVar11;
    if (uVar11 != this->b) {
      if (uVar11 != this->e) {
        pHVar3 = (this_00->data).field_0.head;
        iVar6 = *(int *)((long)pHVar3 + uVar8 * 0x48 + 0x10);
        uVar11 = *(uint *)((long)pHVar3 + uVar8 * 0x48);
        while (uVar11 != 0) {
          uVar9 = (ulong)uVar11;
          puVar1 = (uint *)((long)pHVar3 + (ulong)uVar11 * 0x48);
          if (puVar1[2] == (uint)uVar8) {
            iVar6 = iVar6 + puVar1[4] + puVar1[7];
          }
          uVar8 = uVar9;
          uVar11 = *puVar1;
        }
        this_01 = &this_02->fragments;
        uVar7 = QFragmentMapData<QTextFragmentData>::findNode(&this_01->data,iVar6 + -1,0);
        pQVar4 = &((this_02->text).d.d)->super_QArrayData;
        pcVar5 = (this_02->text).d.ptr;
        if (pQVar4 == (QArrayData *)0x0) {
          cVar2 = pcVar5[(this_01->data).field_0.fragments[uVar7].stringPosition];
        }
        else {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          cVar2 = pcVar5[(this_01->data).field_0.fragments[uVar7].stringPosition];
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
        if (cVar2 != L'\x2029') {
          QTextDocumentPrivate::objectForFormat
                    (this_02,(this_02->fragments).data.field_0.fragments[uVar7].format);
          pQVar10 = (QTextFrame *)QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
          if (pQVar10 != (QTextFrame *)0x0) {
            pQVar4 = &((this_02->text).d.d)->super_QArrayData;
            pcVar5 = (this_02->text).d.ptr;
            if (pQVar4 == (QArrayData *)0x0) {
              cVar2 = pcVar5[(this_01->data).field_0.fragments[uVar7].stringPosition];
            }
            else {
              LOCK();
              (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
              cVar2 = pcVar5[(this_01->data).field_0.fragments[uVar7].stringPosition];
              LOCK();
              (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar4,2,0x10);
              }
            }
            if (cVar2 != L'﷐') {
              pQVar4 = &((this_02->text).d.d)->super_QArrayData;
              pcVar5 = (this_02->text).d.ptr;
              if (pQVar4 == (QArrayData *)0x0) {
                cVar2 = pcVar5[(this_01->data).field_0.fragments[uVar7].stringPosition];
              }
              else {
                LOCK();
                (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
                cVar2 = pcVar5[(this_01->data).field_0.fragments[uVar7].stringPosition];
                LOCK();
                (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(pQVar4,2,0x10);
                }
              }
              if (cVar2 == L'﷑') {
                this->cf = pQVar10;
                this->cb = 0;
                return this;
              }
            }
          }
        }
      }
      uVar7 = QFragmentMapData<QTextBlockData>::previous(&this_00->data,this->cb);
      this->cb = uVar7;
    }
  }
  else {
    iVar6 = firstPosition(this->cf);
    uVar7 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,iVar6 + -1,0);
    this->cb = uVar7;
    this->cf = (QTextFrame *)0x0;
  }
  return this;
}

Assistant:

QTextFrame::iterator &QTextFrame::iterator::operator--()
{
    const QTextDocumentPrivate *priv = QTextDocumentPrivate::get(f);
    const QTextDocumentPrivate::BlockMap &map = priv->blockMap();
    if (cf) {
        int start = cf->firstPosition() - 1;
        cb = map.findNode(start);
        cf = nullptr;
    } else {
        if (cb == b)
            goto end;
        if (cb != e) {
            int pos = map.position(cb);
            // check if we have to enter a frame
            QTextDocumentPrivate::FragmentIterator frag = priv->find(pos-1);
            if (priv->buffer().at(frag->stringPosition) != QChar::ParagraphSeparator) {
                QTextFrame *pf = qobject_cast<QTextFrame *>(priv->objectForFormat(frag->format));
                if (pf) {
                    if (priv->buffer().at(frag->stringPosition) == QTextBeginningOfFrame) {
                        Q_ASSERT(pf == f);
                    } else if (priv->buffer().at(frag->stringPosition) == QTextEndOfFrame) {
                        Q_ASSERT(pf != f);
                        cf = pf;
                        cb = 0;
                        goto end;
                    }
                }
            }
        }
        cb = map.previous(cb);
    }
 end:
    return *this;
}